

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3StrAccumReset(StrAccum *p)

{
  void *in_RDI;
  
  if (*(long *)((long)in_RDI + 0x10) != *(long *)((long)in_RDI + 8)) {
    if (*(char *)((long)in_RDI + 0x24) == '\x01') {
      sqlite3DbFree((sqlite3 *)p,in_RDI);
    }
    else {
      sqlite3_free((void *)0x1235e7);
    }
  }
  *(undefined8 *)((long)in_RDI + 0x10) = 0;
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3StrAccumReset(StrAccum *p){
  if( p->zText!=p->zBase ){
    if( p->useMalloc==1 ){
      sqlite3DbFree(p->db, p->zText);
    }else{
      sqlite3_free(p->zText);
    }
  }
  p->zText = 0;
}